

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_ini_writer::
w_sections<std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>,ini_write_object>
          (xr_ini_writer *this,undefined8 *container,undefined8 param_3)

{
  undefined8 *puVar1;
  ulong uVar2;
  allocator<char> local_51;
  string local_50;
  
  puVar1 = (undefined8 *)container[1];
  uVar2 = 0;
  for (container = (undefined8 *)*container; container != puVar1; container = container + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"%s_%d",&local_51);
    open_section(this,&local_50,param_3,uVar2);
    uVar2 = (ulong)((int)uVar2 + 1);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(*(long *)*container + 0x20))((long *)*container,this);
    close_section(this);
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_sections(const T& container, F write, const char* prefix)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_section("%s_%d", prefix, id++);
		write(*it, this);
		close_section();
	}
}